

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::perform_dwarf_fission_resolution
          (dwarf_resolver *this,die_object *cu_die,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
          *dwo_name,object_frame *object_frame_info,stacktrace_frame *frame,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  bool bVar1;
  cache_mode cVar2;
  Dwarf_Die die;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  dwarf_resolver *this_00;
  pointer ppVar4;
  pointer pdVar5;
  int __flags;
  object_frame *poVar6;
  void *__child_stack;
  void *__child_stack_00;
  stacktrace_frame *__arg;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false,_false>,_bool>
  pVar7;
  frame_with_inlines local_490;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
  local_418;
  undefined1 local_410;
  undefined1 local_401;
  skeleton_info local_400;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0> local_3e0;
  unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>
  local_3b8;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
  local_3b0;
  undefined1 local_3a8;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
  local_3a0;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
  local_398;
  iterator it;
  Dwarf_Off off;
  skeleton_info local_310;
  optional<cpptrace::detail::libdwarf::skeleton_info,_0> local_2f0;
  undefined1 local_2c8 [8];
  dwarf_resolver resolver;
  frame_with_inlines res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string path;
  Dwarf_Half local_64 [2];
  undefined1 local_60 [4];
  Dwarf_Half dwversion;
  Dwarf_Half offset_size;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  comp_dir;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines_local;
  stacktrace_frame *frame_local;
  object_frame *object_frame_info_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  *dwo_name_local;
  die_object *cu_die_local;
  dwarf_resolver *this_local;
  
  poVar6 = object_frame_info;
  __arg = frame;
  comp_dir._32_8_ = inlines;
  bVar1 = detail::optional::operator_cast_to_bool((optional *)dwo_name);
  __flags = (int)poVar6;
  if (!bVar1) {
    return;
  }
  die_object::get_string_attribute_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              *)local_60,cu_die,0x1b);
  local_64[1] = 0;
  local_64[0] = 0;
  die = die_object::get(cu_die);
  dwarf_get_version_of_die(die,local_64,local_64 + 1);
  std::__cxx11::string::string((string *)local_98);
  pbVar3 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           ::unwrap(dwo_name);
  bVar1 = is_absolute(pbVar3);
  if (bVar1) {
    pbVar3 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             ::unwrap(dwo_name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,pbVar3)
    ;
  }
  else {
    bVar1 = detail::optional::operator_cast_to_bool((optional *)local_60);
    if (!bVar1) {
      res.inlines.
      super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      goto LAB_002837be;
    }
    pbVar3 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             ::unwrap((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                       *)local_60);
    std::operator+(&local_d8,pbVar3,'/');
    pbVar3 = optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             ::unwrap(dwo_name);
    std::operator+(&local_b8,&local_d8,pbVar3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
               &local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  frame_with_inlines::frame_with_inlines((frame_with_inlines *)&resolver.skeleton.holds_value);
  cVar2 = get_cache_mode();
  if (cVar2 == prioritize_memory) {
    die_object::clone(&local_310.cu_die,(__fn *)cu_die,__child_stack,__flags,__arg);
    local_310.dwversion = local_64[0];
    local_310.resolver = this;
    optional<cpptrace::detail::libdwarf::skeleton_info,_0>::
    optional<cpptrace::detail::libdwarf::skeleton_info,_0>(&local_2f0,&local_310);
    dwarf_resolver((dwarf_resolver *)local_2c8,(string *)local_98,&local_2f0);
    optional<cpptrace::detail::libdwarf::skeleton_info,_0>::~optional(&local_2f0);
    skeleton_info::~skeleton_info(&local_310);
    resolve_frame((frame_with_inlines *)&off,(dwarf_resolver *)local_2c8,object_frame_info);
    frame_with_inlines::operator=
              ((frame_with_inlines *)&resolver.skeleton.holds_value,(frame_with_inlines *)&off);
    frame_with_inlines::~frame_with_inlines((frame_with_inlines *)&off);
    ~dwarf_resolver((dwarf_resolver *)local_2c8);
  }
  else {
    it.
    super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
               )die_object::get_global_offset(cu_die);
    local_398._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>_>_>
         ::find(&this->split_full_cu_resolvers,(key_type *)&it);
    local_3a0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>_>_>
         ::end(&this->split_full_cu_resolvers);
    bVar1 = std::__detail::operator==(&local_398,&local_3a0);
    if (bVar1) {
      this_00 = (dwarf_resolver *)operator_new(0x170);
      local_401 = 1;
      die_object::clone(&local_400.cu_die,(__fn *)cu_die,__child_stack_00,__flags,__arg);
      local_400.dwversion = local_64[0];
      local_400.resolver = this;
      optional<cpptrace::detail::libdwarf::skeleton_info,_0>::
      optional<cpptrace::detail::libdwarf::skeleton_info,_0>(&local_3e0,&local_400);
      dwarf_resolver(this_00,(string *)local_98,&local_3e0);
      local_401 = 0;
      std::
      unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>
      ::unique_ptr<std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>,void>
                ((unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>
                  *)&local_3b8,this_00);
      pVar7 = std::
              unordered_map<unsigned_long_long,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>,std::hash<unsigned_long_long>,std::equal_to<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>>
              ::
              emplace<unsigned_long_long&,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>
                        ((unordered_map<unsigned_long_long,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>,std::hash<unsigned_long_long>,std::equal_to<unsigned_long_long>,std::allocator<std::pair<unsigned_long_long_const,std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>>>>>
                          *)&this->split_full_cu_resolvers,(unsigned_long_long *)&it,&local_3b8);
      local_418._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false>
           ._M_cur;
      local_410 = pVar7.second;
      local_3b0._M_cur = local_418._M_cur;
      local_3a8 = local_410;
      local_398._M_cur = local_418._M_cur;
      std::
      unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>
      ::~unique_ptr(&local_3b8);
      optional<cpptrace::detail::libdwarf::skeleton_info,_0>::~optional(&local_3e0);
      skeleton_info::~skeleton_info(&local_400);
    }
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_long_long,_std::unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>_>,_false,_false>
                           *)&local_398);
    pdVar5 = std::
             unique_ptr<cpptrace::detail::libdwarf::dwarf_resolver,_std::default_delete<cpptrace::detail::libdwarf::dwarf_resolver>_>
             ::operator->(&ppVar4->second);
    (*(pdVar5->super_symbol_resolver)._vptr_symbol_resolver[2])(&local_490,pdVar5,object_frame_info)
    ;
    frame_with_inlines::operator=((frame_with_inlines *)&resolver.skeleton.holds_value,&local_490);
    frame_with_inlines::~frame_with_inlines(&local_490);
  }
  stacktrace_frame::operator=(frame,(stacktrace_frame *)&resolver.skeleton.holds_value);
  std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::operator=
            ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             comp_dir._32_8_,
             (vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
             &res.frame.is_inline);
  frame_with_inlines::~frame_with_inlines((frame_with_inlines *)&resolver.skeleton.holds_value);
  res.inlines.
  super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_002837be:
  std::__cxx11::string::~string((string *)local_98);
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::
  ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
             *)local_60);
  return;
}

Assistant:

void perform_dwarf_fission_resolution(
            const die_object& cu_die,
            const optional<std::string>& dwo_name,
            const object_frame& object_frame_info,
            stacktrace_frame& frame,
            std::vector<stacktrace_frame>& inlines
        ) {
            // Split dwarf / debug fission / dwo is handled here
            // Location of the split full CU is a combination of DW_AT_dwo_name/DW_AT_GNU_dwo_name and DW_AT_comp_dir
            // https://gcc.gnu.org/wiki/DebugFission
            if(dwo_name) {
                // TODO: DWO ID?
                auto comp_dir = cu_die.get_string_attribute(DW_AT_comp_dir);
                Dwarf_Half offset_size = 0;
                Dwarf_Half dwversion = 0;
                dwarf_get_version_of_die(cu_die.get(), &dwversion, &offset_size);
                std::string path;
                if(is_absolute(dwo_name.unwrap())) {
                    path = dwo_name.unwrap();
                } else if(comp_dir) {
                    path = comp_dir.unwrap() + PATH_SEP + dwo_name.unwrap();
                } else {
                    // maybe default to dwo_name but for now not doing anything
                    return;
                }
                // todo: slight inefficiency in this copy-back strategy due to other frame members
                frame_with_inlines res;
                if(get_cache_mode() == cache_mode::prioritize_memory) {
                    dwarf_resolver resolver(
                        path,
                        skeleton_info{cu_die.clone(), dwversion, *this}
                    );
                    res = resolver.resolve_frame(object_frame_info);
                } else {
                    auto off = cu_die.get_global_offset();
                    auto it = split_full_cu_resolvers.find(off);
                    if(it == split_full_cu_resolvers.end()) {
                        it = split_full_cu_resolvers.emplace(
                            off,
                            std::unique_ptr<dwarf_resolver>(
                                new dwarf_resolver(
                                    path,
                                    skeleton_info{cu_die.clone(), dwversion, *this}
                                )
                            )
                        ).first;
                    }
                    res = it->second->resolve_frame(object_frame_info);
                }
                frame = std::move(res.frame);
                inlines = std::move(res.inlines);
            }
        }